

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_stream.cpp
# Opt level: O2

void __thiscall cppnet::LogStream::~LogStream(LogStream *this)

{
  __shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  if (((this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) &&
     ((this->_call_back).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::__shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_28,(__shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::function<void_(std::shared_ptr<cppnet::Log>)>::operator()
              (&this->_call_back,(shared_ptr<cppnet::Log> *)&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  }
  std::_Function_base::~_Function_base(&(this->_call_back).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->_log).super___shared_ptr<cppnet::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

LogStream::~LogStream() {
    if (_log && _call_back) {
        _call_back(_log);
    }
}